

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultSoftBodySolver.cpp
# Opt level: O3

void __thiscall
btDefaultSoftBodySolver::copySoftBodyToVertexBuffer
          (btDefaultSoftBodySolver *this,btSoftBody *softBody,btVertexBufferDescriptor *vertexBuffer
          )

{
  undefined4 uVar1;
  uint uVar2;
  Node *pNVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined4 *puVar8;
  long lVar9;
  
  iVar5 = (**(code **)(*(long *)vertexBuffer + 0x20))(vertexBuffer);
  if (iVar5 == 0) {
    uVar2 = (softBody->m_nodes).m_size;
    lVar7 = (**(code **)(*(long *)vertexBuffer + 0x48))(vertexBuffer);
    cVar4 = (**(code **)(*(long *)vertexBuffer + 0x10))(vertexBuffer);
    if (cVar4 != '\0') {
      iVar5 = (**(code **)(*(long *)vertexBuffer + 0x28))(vertexBuffer);
      iVar6 = (**(code **)(*(long *)vertexBuffer + 0x30))();
      if (0 < (int)uVar2) {
        pNVar3 = (softBody->m_nodes).m_data;
        puVar8 = (undefined4 *)(lVar7 + (long)iVar5 * 4 + 8);
        lVar9 = 0;
        do {
          uVar1 = *(undefined4 *)((long)(pNVar3->m_x).m_floats + lVar9 + 8);
          *(undefined8 *)(puVar8 + -2) = *(undefined8 *)((long)(pNVar3->m_x).m_floats + lVar9);
          *puVar8 = uVar1;
          lVar9 = lVar9 + 0x78;
          puVar8 = puVar8 + iVar6;
        } while ((ulong)uVar2 * 0x78 - lVar9 != 0);
      }
    }
    cVar4 = (**(code **)(*(long *)vertexBuffer + 0x18))(vertexBuffer);
    if (cVar4 != '\0') {
      iVar5 = (**(code **)(*(long *)vertexBuffer + 0x38))(vertexBuffer);
      iVar6 = (**(code **)(*(long *)vertexBuffer + 0x40))();
      if (0 < (int)uVar2) {
        pNVar3 = (softBody->m_nodes).m_data;
        puVar8 = (undefined4 *)(lVar7 + (long)iVar5 * 4 + 8);
        lVar7 = 0;
        do {
          uVar1 = *(undefined4 *)((long)(pNVar3->m_n).m_floats + lVar7 + 8);
          *(undefined8 *)(puVar8 + -2) = *(undefined8 *)((long)(pNVar3->m_n).m_floats + lVar7);
          *puVar8 = uVar1;
          lVar7 = lVar7 + 0x78;
          puVar8 = puVar8 + iVar6;
        } while ((ulong)uVar2 * 0x78 - lVar7 != 0);
      }
    }
  }
  return;
}

Assistant:

void btDefaultSoftBodySolver::copySoftBodyToVertexBuffer( const btSoftBody *const softBody, btVertexBufferDescriptor *vertexBuffer )
{
	// Currently only support CPU output buffers
	// TODO: check for DX11 buffers. Take all offsets into the same DX11 buffer
	// and use them together on a single kernel call if possible by setting up a
	// per-cloth target buffer array for the copy kernel.

	if( vertexBuffer->getBufferType() == btVertexBufferDescriptor::CPU_BUFFER )
	{
		const btAlignedObjectArray<btSoftBody::Node> &clothVertices( softBody->m_nodes );
		int numVertices = clothVertices.size();

		const btCPUVertexBufferDescriptor *cpuVertexBuffer = static_cast< btCPUVertexBufferDescriptor* >(vertexBuffer);						
		float *basePointer = cpuVertexBuffer->getBasePointer();						

		if( vertexBuffer->hasVertexPositions() )
		{
			const int vertexOffset = cpuVertexBuffer->getVertexOffset();
			const int vertexStride = cpuVertexBuffer->getVertexStride();
			float *vertexPointer = basePointer + vertexOffset;

			for( int vertexIndex = 0; vertexIndex < numVertices; ++vertexIndex )
			{
				btVector3 position = clothVertices[vertexIndex].m_x;
				*(vertexPointer + 0) = position.getX();
				*(vertexPointer + 1) = position.getY();
				*(vertexPointer + 2) = position.getZ();
				vertexPointer += vertexStride;
			}
		}
		if( vertexBuffer->hasNormals() )
		{
			const int normalOffset = cpuVertexBuffer->getNormalOffset();
			const int normalStride = cpuVertexBuffer->getNormalStride();
			float *normalPointer = basePointer + normalOffset;

			for( int vertexIndex = 0; vertexIndex < numVertices; ++vertexIndex )
			{
				btVector3 normal = clothVertices[vertexIndex].m_n;
				*(normalPointer + 0) = normal.getX();
				*(normalPointer + 1) = normal.getY();
				*(normalPointer + 2) = normal.getZ();
				normalPointer += normalStride;
			}
		}
	}
}